

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_153ab3::CtorVtableSpecialName::printLeft
          (CtorVtableSpecialName *this,OutputStream *S)

{
  StringView local_38;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  CtorVtableSpecialName *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  StringView::StringView(&local_28,"construction vtable for ");
  OutputStream::operator+=(local_18,local_28);
  Node::print(this->FirstType,local_18);
  StringView::StringView(&local_38,"-in-");
  OutputStream::operator+=(local_18,local_38);
  Node::print(this->SecondType,local_18);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "construction vtable for ";
    FirstType->print(S);
    S += "-in-";
    SecondType->print(S);
  }